

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variablebyte.h
# Opt level: O3

void __thiscall
FastPForLib::VariableByte::encodeToByteArray<unsigned_int>
          (VariableByte *this,uint *in,size_t length,uint8_t *bout,size_t *nvalue)

{
  uint uVar1;
  byte *pbVar2;
  size_t sVar3;
  byte bVar4;
  
  pbVar2 = bout;
  if (length != 0) {
    sVar3 = 0;
    do {
      uVar1 = in[sVar3];
      bVar4 = (byte)uVar1;
      if (uVar1 < 0x80) {
        *pbVar2 = bVar4 | 0x80;
        pbVar2 = pbVar2 + 1;
      }
      else if (uVar1 < 0x4000) {
        *pbVar2 = bVar4 & 0x7f;
        pbVar2[1] = (byte)(uVar1 >> 7) | 0x80;
        pbVar2 = pbVar2 + 2;
      }
      else if (uVar1 < 0x200000) {
        *pbVar2 = bVar4 & 0x7f;
        pbVar2[1] = (byte)(uVar1 >> 7) & 0x7f;
        pbVar2[2] = (byte)(uVar1 >> 0xe) | 0x80;
        pbVar2 = pbVar2 + 3;
      }
      else {
        *pbVar2 = bVar4 & 0x7f;
        pbVar2[1] = (byte)(uVar1 >> 7) & 0x7f;
        pbVar2[2] = (byte)(uVar1 >> 0xe) & 0x7f;
        bVar4 = (byte)(uVar1 >> 0x15);
        if (uVar1 < 0x10000000) {
          pbVar2[3] = bVar4 | 0x80;
          pbVar2 = pbVar2 + 4;
        }
        else {
          pbVar2[3] = bVar4 & 0x7f;
          pbVar2[4] = (byte)(uVar1 >> 0x1c) | 0x80;
          pbVar2 = pbVar2 + 5;
        }
      }
      sVar3 = sVar3 + 1;
    } while (length != sVar3);
  }
  *nvalue = (long)pbVar2 - (long)bout;
  return;
}

Assistant:

void encodeToByteArray(const T *in, const size_t length, uint8_t *bout,
                         size_t &nvalue) {
    const uint8_t *const initbout = bout;
    for (size_t k = 0; k < length; ++k) {
      const uint64_t val = in[k];
      /**
       * Code below could be shorter. Whether it could be faster
       * depends on your compiler and machine.
       */
      if (val < (1ULL << 7)) {
        *bout = static_cast<uint8_t>(val | 0x80);
        ++bout;
      } else if (val < (1ULL << 14)) {
        *bout = extract7bits<0>(val);
        ++bout;
        *bout = extract7bitsmaskless<1>(val) | 0x80;
        ++bout;
      } else if (val < (1ULL << 21)) {
        *bout = extract7bits<0>(val);
        ++bout;
        *bout = extract7bits<1>(val);
        ++bout;
        *bout = extract7bitsmaskless<2>(val) | 0x80;
        ++bout;
      } else if (val < (1ULL << 28)) {
        *bout = extract7bits<0>(val);
        ++bout;
        *bout = extract7bits<1>(val);
        ++bout;
        *bout = extract7bits<2>(val);
        ++bout;
        *bout = extract7bitsmaskless<3>(val) | 0x80;
        ++bout;
      } else if (val < (1ULL << 35)) {
        *bout = extract7bits<0>(val);
        ++bout;
        *bout = extract7bits<1>(val);
        ++bout;
        *bout = extract7bits<2>(val);
        ++bout;
        *bout = extract7bits<3>(val);
        ++bout;
        *bout = extract7bitsmaskless<4>(val) | 0x80;
        ++bout;
      } else if (val < (1ULL << 42)) {
        *bout = extract7bits<0>(val);
        ++bout;
        *bout = extract7bits<1>(val);
        ++bout;
        *bout = extract7bits<2>(val);
        ++bout;
        *bout = extract7bits<3>(val);
        ++bout;
        *bout = extract7bits<4>(val);
        ++bout;
        *bout = extract7bitsmaskless<5>(val) | 0x80;
        ++bout;
      } else if (val < (1ULL << 49)) {
        *bout = extract7bits<0>(val);
        ++bout;
        *bout = extract7bits<1>(val);
        ++bout;
        *bout = extract7bits<2>(val);
        ++bout;
        *bout = extract7bits<3>(val);
        ++bout;
        *bout = extract7bits<4>(val);
        ++bout;
        *bout = extract7bits<5>(val);
        ++bout;
        *bout = extract7bitsmaskless<6>(val) | 0x80;
        ++bout;
      } else if (val < (1ULL << 56)) {
        *bout = extract7bits<0>(val);
        ++bout;
        *bout = extract7bits<1>(val);
        ++bout;
        *bout = extract7bits<2>(val);
        ++bout;
        *bout = extract7bits<3>(val);
        ++bout;
        *bout = extract7bits<4>(val);
        ++bout;
        *bout = extract7bits<5>(val);
        ++bout;
        *bout = extract7bits<6>(val);
        ++bout;
        *bout = extract7bitsmaskless<7>(val) | 0x80;
        ++bout;
      } else if (val < (1ULL << 63)) {
        *bout = extract7bits<0>(val);
        ++bout;
        *bout = extract7bits<1>(val);
        ++bout;
        *bout = extract7bits<2>(val);
        ++bout;
        *bout = extract7bits<3>(val);
        ++bout;
        *bout = extract7bits<4>(val);
        ++bout;
        *bout = extract7bits<5>(val);
        ++bout;
        *bout = extract7bits<6>(val);
        ++bout;
        *bout = extract7bits<7>(val);
        ++bout;
        *bout = extract7bitsmaskless<8>(val) | 0x80;
        ++bout;
      } else {
        *bout = extract7bits<0>(val);
        ++bout;
        *bout = extract7bits<1>(val);
        ++bout;
        *bout = extract7bits<2>(val);
        ++bout;
        *bout = extract7bits<3>(val);
        ++bout;
        *bout = extract7bits<4>(val);
        ++bout;
        *bout = extract7bits<5>(val);
        ++bout;
        *bout = extract7bits<6>(val);
        ++bout;
        *bout = extract7bits<7>(val);
        ++bout;
        *bout = extract7bits<8>(val);
        ++bout;
        *bout = extract7bitsmaskless<9>(val) | 0x80;
        ++bout;
      }
    }
    nvalue = bout - initbout;
  }